

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

void remove_comments(char *string,char *start_token,char *end_token)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *__n;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  
  __n = (char *)strlen(start_token);
  sVar5 = strlen(end_token);
  if (sVar5 == 0 || __n == (char *)0x0) {
    return;
  }
  bVar3 = false;
  do {
    bVar2 = false;
    pcVar7 = string;
    pcVar8 = __n;
    while( true ) {
      cVar1 = *pcVar7;
      if (cVar1 == '\0') {
        return;
      }
      if ((bool)(cVar1 != '\\' | bVar2)) break;
      pcVar7 = pcVar7 + 1;
      pcVar8 = pcVar8 + 1;
      bVar2 = true;
    }
    if (bVar2 || cVar1 != '\"') {
      bVar2 = !bVar3;
      bVar3 = true;
      if (bVar2) {
        iVar4 = strncmp(pcVar7,start_token,(size_t)__n);
        bVar3 = false;
        if (iVar4 == 0) {
          for (pcVar6 = (char *)0x0; __n != pcVar6; pcVar6 = pcVar6 + 1) {
            pcVar7[(long)pcVar6] = ' ';
          }
          pcVar7 = strstr(pcVar7 + (long)__n,end_token);
          if (pcVar7 == (char *)0x0) {
            return;
          }
          for (; pcVar7 + (sVar5 - (long)string) != pcVar8; pcVar8 = pcVar8 + 1) {
            string[(long)pcVar8] = ' ';
          }
          pcVar7 = pcVar7 + (sVar5 - 1);
          bVar3 = false;
        }
      }
    }
    else {
      bVar3 = !bVar3;
    }
    string = pcVar7 + 1;
  } while( true );
}

Assistant:

static void remove_comments(char *string, const char *start_token, const char *end_token) {
    parson_bool_t in_string = PARSON_FALSE, escaped = PARSON_FALSE;
    size_t i;
    char *ptr = NULL, current_char;
    size_t start_token_len = strlen(start_token);
    size_t end_token_len = strlen(end_token);
    if (start_token_len == 0 || end_token_len == 0) {
        return;
    }
    while ((current_char = *string) != '\0') {
        if (current_char == '\\' && !escaped) {
            escaped = PARSON_TRUE;
            string++;
            continue;
        } else if (current_char == '\"' && !escaped) {
            in_string = !in_string;
        } else if (!in_string && strncmp(string, start_token, start_token_len) == 0) {
            for(i = 0; i < start_token_len; i++) {
                string[i] = ' ';
            }
            string = string + start_token_len;
            ptr = strstr(string, end_token);
            if (!ptr) {
                return;
            }
            for (i = 0; i < (ptr - string) + end_token_len; i++) {
                string[i] = ' ';
            }
            string = ptr + end_token_len - 1;
        }
        escaped = PARSON_FALSE;
        string++;
    }
}